

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

int ON_wString::FormatVargsOutputCount(wchar_t *format,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  wchar_t *__format;
  size_t buffer_capacity;
  ON_wStringBuffer buffer;
  va_list args_copy;
  ON_wStringBuffer clang_format_buffer;
  wchar_t clang_format_stack_buffer [128];
  wchar_t stack_buffer [1024];
  
  iVar2 = 0;
  if ((format != (wchar_t *)0x0) && (*format != L'\0')) {
    ON_wStringBuffer::ON_wStringBuffer(&clang_format_buffer,clang_format_stack_buffer,0x80);
    __format = ConvertToCLangFormat(format,&clang_format_buffer);
    ON_wStringBuffer::ON_wStringBuffer(&buffer,stack_buffer,0x400);
    buffer_capacity = buffer.m_buffer_capacity;
    while( true ) {
      args_copy[0].reg_save_area = args->reg_save_area;
      args_copy[0].gp_offset = args->gp_offset;
      args_copy[0].fp_offset = args->fp_offset;
      args_copy[0].overflow_arg_area = args->overflow_arg_area;
      iVar2 = vswprintf(buffer.m_buffer,buffer.m_buffer_capacity,__format,args_copy);
      if (-1 < iVar2) goto LAB_005c7177;
      if (0x3fffff < buffer_capacity) break;
      buffer_capacity = buffer_capacity << 4;
      bVar1 = ON_wStringBuffer::GrowBuffer(&buffer,buffer_capacity);
      if (((!bVar1) || (buffer.m_buffer == (wchar_t *)0x0)) ||
         (buffer_capacity < buffer.m_buffer_capacity)) break;
    }
    iVar2 = -1;
LAB_005c7177:
    ON_wStringBuffer::~ON_wStringBuffer(&buffer);
    ON_wStringBuffer::~ON_wStringBuffer(&clang_format_buffer);
  }
  return iVar2;
}

Assistant:

int ON_wString::FormatVargsOutputCount(
  const wchar_t* format,
  va_list args
  )
{
  if ( nullptr == format || 0 == format[0] )
    return 0;

#if defined(ON_COMPILER_CLANG)
  // Unlike _vscwprintf_p_l(), CLang's vswprintf() does not tell you how many characters would have 
  // been written if there was space enough in the buffer. 
  // It reports an error when there is not enough space.  
  // Assume a moderately large machine so kilobytes of wchar_t on the stack is not a problem.

  // CLang requires %ls to properly format a const wchar_t* parameter
  wchar_t clang_format_stack_buffer[128];
  ON_wStringBuffer clang_format_buffer(clang_format_stack_buffer, sizeof(clang_format_stack_buffer) / sizeof(clang_format_stack_buffer[0]));
  format = ConvertToCLangFormat(
    format,
    clang_format_buffer
    );

  // Attempting to directly get the count fails in OS X 10.4 June 2015 (always returns fmt_size = -1)
  //
  ////va_list args_copy;
  ////va_copy(args_copy, args);
  ////const int formatted_string_count = vswprintf_l(nullptr, 0, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
  ////va_end(args_copy);
  ////return (formatted_string_count >= 0) ? formatted_string_count : -1;
  
  wchar_t stack_buffer[1024];
  ON_wStringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  size_t buffer_capacity = buffer.m_buffer_capacity;
  for(;;)
  {
    va_list args_copy;
    va_copy(args_copy, args);

    // NOTE:
    //   Cannot use Apple's vswprintf_l() because it's buggy. 
    //   This means we cannot be certain that a period will be used for a decimal point in formatted printing.
    //
    //   Apple's OS X 10.4 (July 2015) formatted printing functions are buggy when locale is specified.
    //   Here's what happens:
    ////    int ON_VARGS_FUNC_CDECL VargsFormatFuncA(const wchar_t* format, ...)
    ////    {
    ////      va_list args;
    ////      va_start(args, format);
    ////      wchar_t buffer[128];
    ////      int count = vswprintf(buffer, 128, format, args);
    ////      va_end(args);
    ////      return count;
    ////    }
    ////       
    ////    int ON_VARGS_FUNC_CDECL VargsFormatFuncB(const wchar_t* format, ...)
    ////    {
    ////      va_list args;
    ////      va_start(args, format);
    ////      wchar_t buffer[128];
    ////    #if defined(ON_COMPILER_CLANG)
    ////      int count = vswprintf_l(buffer, 128, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
    ////    #else
    ////      int count = _vswprintf_p_l(buffer, 128, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
    ////    #endif
    ////      va_end(args);
    ////      return count;
    ////    }    ////        
    ////    
    ////    Tests()
    ////    {
    ////      const wchar_t str1[5] = {'T', 'e',   's', 't', 0};
    ////      const wchar_t str2[5] = {'T', 0xFFFD,'s', 't', 0};
    ////    
    ////      int Acount1 = VargsFormatFuncA(L"%ls",str1);
    ////      int Acount2 = VargsFormatFuncA(L"%ls",str2);
    ////    
    ////      RhinoApp().Print("Acount1 = %d Acount2 = %d\n",Acount1,Acount2);
    ////      
    ////      int Bcount1 = VargsFormatFuncB(L"%ls",str1);
    ////      int Bcount2 = VargsFormatFuncB(L"%ls",str2);
    ////    
    ////       // Windows Results: Acount1 = 4, Acount2 = 4, Bcount1 = 4, Bcount2 = 4
    ////       // Apple   Results: Acount1 = 4, Acount2 = 4, Bcount1 = 4, Bcount2 = -1
    ////    }
    ////      
    //const int formatted_string_count = vswprintf_l(buffer.m_buffer, buffer.m_buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
    const int formatted_string_count = vswprintf(buffer.m_buffer, buffer.m_buffer_capacity, format, args_copy);
    va_end(args_copy);
    if (formatted_string_count >= 0)
    {
      // formatted_string_count = number of wchar_t elements not including null terminator
      return formatted_string_count;
    }
    if ( buffer_capacity >= 1024*16*16*16 )
      break;
    buffer_capacity *= 16;
    if (false == buffer.GrowBuffer(buffer_capacity))
      break;
    if (nullptr == buffer.m_buffer)
      break;
    if (buffer_capacity < buffer.m_buffer_capacity)
      break;
  }
  return -1;
#else
#if defined(ON_COMPILER_GNU)
  // 31 May 2019 S. Baer (RH-52038)
  // TODO: The following code needs to be tested. This was added by request from a user that needed
  // a GCC compile. This is obviously a cut and paste of the above clang code
  wchar_t stack_buffer[1024];
  ON_wStringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  size_t buffer_capacity = buffer.m_buffer_capacity;
  for(;;)
  {
    va_list args_copy;
    va_copy(args_copy, args);

    const int formatted_string_count = vswprintf(buffer.m_buffer, buffer.m_buffer_capacity, format, args_copy);
    va_end(args_copy);
    if (formatted_string_count >= 0)
    {
      // formatted_string_count = number of wchar_t elements not including null terminator
      return formatted_string_count;
    }
    if ( buffer_capacity >= 1024*16*16*16 )
      break;
    buffer_capacity *= 16;
    if (false == buffer.GrowBuffer(buffer_capacity))
      break;
    if (nullptr == buffer.m_buffer)
      break;
    if (buffer_capacity < buffer.m_buffer_capacity)
      break;
  }
  return -1;
#else
  // Using ON_Locale::Ordinal.NumericLocalePtr() insures that a period 
  // will be use for the decimal point in formatted printing.
  return _vscwprintf_p_l(format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
#endif
}